

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint preProcessScanlines(uchar **out,size_t *outsize,uchar *in,uint w,uint h,LodePNGInfo *info_png,
                        LodePNGEncoderSettings *settings)

{
  LodePNGColorMode *color;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  uchar *puVar7;
  uchar *out_00;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  size_t bytewidth;
  byte bVar15;
  uint uVar16;
  uint local_298;
  ulong local_288;
  ulong local_250;
  uint passh [7];
  uint passw [7];
  uint passh_1 [7];
  uint passw_1 [7];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  size_t local_138 [8];
  size_t passstart [8];
  size_t padded_passstart_1 [8];
  size_t filter_passstart_1 [8];
  
  color = &info_png->color;
  uVar10 = (info_png->color).bitdepth;
  uVar5 = getNumColorChannels((info_png->color).colortype);
  uVar5 = uVar5 * uVar10;
  if (info_png->interlace_method == 0) {
    uVar10 = uVar5 * w;
    uVar16 = (uVar10 + 7 >> 3) * h;
    uVar6 = uVar16 + h;
    *outsize = (ulong)uVar6;
    puVar7 = (uchar *)malloc((ulong)uVar6);
    *out = puVar7;
    if (uVar6 != 0 && puVar7 == (uchar *)0x0) {
      return 0x53;
    }
    if ((7 < uVar5) || (uVar5 = uVar10 + 7 & 0xfffffff8, uVar10 == uVar5)) {
      uVar10 = filter(puVar7,in,w,h,color,settings);
      return uVar10;
    }
    out_00 = (uchar *)malloc((ulong)uVar16);
    uVar6 = 0x53;
    if (out_00 != (uchar *)0x0) {
      addPaddingBits(out_00,in,(ulong)uVar5,(ulong)uVar10,h);
      uVar6 = filter(puVar7,out_00,w,h,color,settings);
    }
  }
  else {
    Adam7_getpassvalues(passw,passh,filter_passstart,padded_passstart,passstart,w,h,uVar5);
    *outsize = filter_passstart[7];
    puVar7 = (uchar *)malloc(filter_passstart[7]);
    *out = puVar7;
    out_00 = (uchar *)malloc(passstart[7]);
    uVar6 = 0x53;
    if (puVar7 != (uchar *)0x0 && (passstart[7] == 0 || out_00 != (uchar *)0x0)) {
      Adam7_getpassvalues(passw_1,passh_1,filter_passstart_1,padded_passstart_1,local_138,w,h,uVar5)
      ;
      if (uVar5 < 8) {
        lVar8 = 0;
        do {
          uVar10 = passh_1[lVar8];
          if (uVar10 != 0) {
            uVar6 = passw_1[lVar8];
            local_298 = 0;
            do {
              if ((ulong)uVar6 != 0) {
                uVar16 = ADAM7_DY[lVar8];
                uVar1 = ADAM7_IY[lVar8];
                uVar2 = ADAM7_DX[lVar8];
                sVar4 = local_138[lVar8];
                uVar3 = ADAM7_IX[lVar8];
                uVar12 = 0;
                do {
                  if (uVar5 != 0) {
                    uVar11 = (ulong)((uVar6 * local_298 + (int)uVar12) * uVar5) + sVar4 * 8;
                    uVar9 = (ulong)((uVar2 * (int)uVar12 + (uVar16 * local_298 + uVar1) * w + uVar3)
                                   * uVar5);
                    uVar13 = uVar5;
                    do {
                      bVar15 = '\x01' << (~(byte)uVar11 & 7);
                      if ((in[uVar9 >> 3] >> (~(byte)uVar9 & 7) & 1) == 0) {
                        out_00[uVar11 >> 3] = out_00[uVar11 >> 3] & ~bVar15;
                      }
                      else {
                        out_00[uVar11 >> 3] = out_00[uVar11 >> 3] | bVar15;
                      }
                      uVar11 = uVar11 + 1;
                      uVar9 = uVar9 + 1;
                      uVar13 = uVar13 - 1;
                    } while (uVar13 != 0);
                  }
                  uVar12 = uVar12 + 1;
                } while (uVar12 != uVar6);
              }
              local_298 = local_298 + 1;
            } while (local_298 != uVar10);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 7);
      }
      else {
        uVar12 = (ulong)(uVar5 >> 3);
        lVar8 = 0;
        do {
          uVar10 = passh_1[lVar8];
          if ((ulong)uVar10 != 0) {
            uVar9 = (ulong)passw_1[lVar8];
            local_250 = 0;
            local_288 = 0;
            do {
              if (uVar9 != 0) {
                uVar6 = ADAM7_DX[lVar8];
                sVar4 = local_138[lVar8];
                uVar16 = (ADAM7_DY[lVar8] * (int)local_288 + ADAM7_IY[lVar8]) * w + ADAM7_IX[lVar8];
                uVar11 = uVar9;
                uVar14 = local_250;
                do {
                  memcpy(out_00 + (uVar14 & 0xffffffff) * uVar12 + sVar4,in + uVar16 * uVar12,uVar12
                        );
                  uVar16 = uVar16 + uVar6;
                  uVar14 = uVar14 + 1;
                  uVar11 = uVar11 - 1;
                } while (uVar11 != 0);
              }
              local_288 = local_288 + 1;
              local_250 = local_250 + uVar9;
            } while (local_288 != uVar10);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 7);
      }
      lVar8 = 0;
      do {
        if (uVar5 < 8) {
          puVar7 = (uchar *)malloc(*(long *)((long)padded_passstart + lVar8 * 2 + 8) -
                                   *(long *)((long)padded_passstart + lVar8 * 2));
          if (puVar7 == (uchar *)0x0) {
            uVar6 = 0x53;
            goto LAB_0011ffab;
          }
          uVar10 = *(uint *)((long)passw + lVar8);
          uVar16 = uVar10 * uVar5;
          uVar6 = *(uint *)((long)passh + lVar8);
          addPaddingBits(puVar7,out_00 + *(long *)((long)passstart + lVar8 * 2),
                         (ulong)(uVar16 + 7 & 0xfffffff8),(ulong)uVar16,uVar6);
          uVar6 = filter(*out + *(long *)((long)filter_passstart + lVar8 * 2),puVar7,uVar10,uVar6,
                         color,settings);
          free(puVar7);
        }
        else {
          uVar6 = filter(*out + *(long *)((long)filter_passstart + lVar8 * 2),
                         out_00 + *(long *)((long)padded_passstart + lVar8 * 2),
                         *(uint *)((long)passw + lVar8),*(uint *)((long)passh + lVar8),color,
                         settings);
        }
        if (uVar6 != 0) goto LAB_0011ffab;
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0x1c);
      uVar6 = 0;
    }
  }
LAB_0011ffab:
  free(out_00);
  return uVar6;
}

Assistant:

static unsigned preProcessScanlines(unsigned char** out, size_t* outsize, const unsigned char* in,
                                    unsigned w, unsigned h,
                                    const LodePNGInfo* info_png, const LodePNGEncoderSettings* settings) {
  /*
  This function converts the pure 2D image with the PNG's colortype, into filtered-padded-interlaced data. Steps:
  *) if no Adam7: 1) add padding bits (= possible extra bits per scanline if bpp < 8) 2) filter
  *) if adam7: 1) Adam7_interlace 2) 7x add padding bits 3) 7x filter
  */
  unsigned bpp = lodepng_get_bpp(&info_png->color);
  unsigned error = 0;

  if(info_png->interlace_method == 0) {
    *outsize = h + (h * ((w * bpp + 7u) / 8u)); /*image size plus an extra byte per scanline + possible padding bits*/
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!(*out) && (*outsize)) error = 83; /*alloc fail*/

    if(!error) {
      /*non multiple of 8 bits per scanline, padding bits needed per scanline*/
      if(bpp < 8 && w * bpp != ((w * bpp + 7u) / 8u) * 8u) {
        unsigned char* padded = (unsigned char*)lodepng_malloc(h * ((w * bpp + 7u) / 8u));
        if(!padded) error = 83; /*alloc fail*/
        if(!error) {
          addPaddingBits(padded, in, ((w * bpp + 7u) / 8u) * 8u, w * bpp, h);
          error = filter(*out, padded, w, h, &info_png->color, settings);
        }
        lodepng_free(padded);
      } else {
        /*we can immediately filter into the out buffer, no other steps needed*/
        error = filter(*out, in, w, h, &info_png->color, settings);
      }
    }
  } else /*interlace_method is 1 (Adam7)*/ {
    unsigned passw[7], passh[7];
    size_t filter_passstart[8], padded_passstart[8], passstart[8];
    unsigned char* adam7;

    Adam7_getpassvalues(passw, passh, filter_passstart, padded_passstart, passstart, w, h, bpp);

    *outsize = filter_passstart[7]; /*image size plus an extra byte per scanline + possible padding bits*/
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!(*out)) error = 83; /*alloc fail*/

    adam7 = (unsigned char*)lodepng_malloc(passstart[7]);
    if(!adam7 && passstart[7]) error = 83; /*alloc fail*/

    if(!error) {
      unsigned i;

      Adam7_interlace(adam7, in, w, h, bpp);
      for(i = 0; i != 7; ++i) {
        if(bpp < 8) {
          unsigned char* padded = (unsigned char*)lodepng_malloc(padded_passstart[i + 1] - padded_passstart[i]);
          if(!padded) ERROR_BREAK(83); /*alloc fail*/
          addPaddingBits(padded, &adam7[passstart[i]],
                         ((passw[i] * bpp + 7u) / 8u) * 8u, passw[i] * bpp, passh[i]);
          error = filter(&(*out)[filter_passstart[i]], padded,
                         passw[i], passh[i], &info_png->color, settings);
          lodepng_free(padded);
        } else {
          error = filter(&(*out)[filter_passstart[i]], &adam7[padded_passstart[i]],
                         passw[i], passh[i], &info_png->color, settings);
        }

        if(error) break;
      }
    }

    lodepng_free(adam7);
  }

  return error;
}